

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void __thiscall VmFunction::UpdateLiveSets(VmFunction *this,VmModule *module)

{
  VmBlock *pVVar1;
  VmValue **ppVVar2;
  uint newSize;
  bool bVar3;
  VmInstruction **ppVVar4;
  char *__function;
  VmBlock *pVVar5;
  ulong uVar6;
  VmInstruction *pVVar7;
  ulong uVar8;
  VmInstruction *pVVar9;
  uint newSize_00;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint *puVar15;
  VmBlock *pVVar16;
  SmallArray<VmInstruction_*,_4U> *pSVar17;
  SmallArray<VmBlock_*,_32U> worklist;
  SmallArray<VmBlock_*,_32U> local_148;
  
  local_148.allocator = module->allocator;
  local_148.data = local_148.little;
  local_148.count = 0;
  local_148.max = 0x20;
  pVVar16 = this->firstBlock;
  if (pVVar16 != (VmBlock *)0x0) {
    do {
      (pVVar16->liveIn).count = 0;
      (pVVar16->liveOut).count = 0;
      if (local_148.count == local_148.max) {
        SmallArray<VmBlock_*,_32U>::grow(&local_148,local_148.count);
      }
      if (local_148.data == (VmBlock **)0x0) goto LAB_00271452;
      uVar6 = (ulong)local_148.count;
      local_148.count = local_148.count + 1;
      local_148.data[uVar6] = pVVar16;
      pVVar16 = pVVar16->nextSibling;
      uVar10 = local_148.count;
    } while (pVVar16 != (VmBlock *)0x0);
    while (uVar10 != 0) {
      local_148.count = uVar10 - 1;
      pVVar16 = local_148.data[local_148.count];
      (pVVar16->liveOut).count = 0;
      uVar10 = (pVVar16->successors).count;
      if (uVar10 == 0) {
        uVar11 = (pVVar16->liveIn).count;
        (pVVar16->liveIn).count = 0;
LAB_0027122b:
        newSize = 0;
      }
      else {
        pSVar17 = &pVVar16->liveOut;
        newSize_00 = 0;
        uVar6 = 0;
        do {
          pVVar1 = (pVVar16->successors).data[uVar6];
          if ((pVVar1->liveIn).count != 0) {
            uVar8 = 0;
            do {
              pVVar9 = (pVVar1->liveIn).data[uVar8];
              if (pVVar9->cmd == VM_INST_PHI) {
                uVar10 = (pVVar9->arguments).count;
                if (uVar10 != 0) {
                  uVar14 = 0;
                  bVar3 = false;
                  do {
                    ppVVar2 = (pVVar9->arguments).data;
                    pVVar7 = (VmInstruction *)ppVVar2[uVar14];
                    if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
                      pVVar7 = (VmInstruction *)0x0;
                    }
                    uVar11 = (uint)uVar14 | 1;
                    if (uVar10 <= uVar11) {
                      __assert_fail("index < count",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                    ,0x199,
                                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                                   );
                    }
                    pVVar5 = (VmBlock *)ppVVar2[uVar11];
                    if ((pVVar5 == (VmBlock *)0x0) || ((pVVar5->super_VmValue).typeID != 3)) {
                      pVVar5 = (VmBlock *)0x0;
                    }
                    if (pVVar5 == pVVar16) {
                      if (newSize_00 == 0) {
LAB_00271022:
                        if (newSize_00 == (pVVar16->liveOut).max) {
                          SmallArray<VmInstruction_*,_4U>::grow(pSVar17,newSize_00);
                        }
                        if (pSVar17->data == (VmInstruction **)0x0) goto LAB_00271414;
                        uVar10 = (pVVar16->liveOut).count;
                        newSize_00 = uVar10 + 1;
                        (pVVar16->liveOut).count = newSize_00;
                        pSVar17->data[uVar10] = pVVar7;
                        uVar10 = (pVVar9->arguments).count;
                        bVar3 = true;
                      }
                      else {
                        bVar3 = true;
                        if (*pSVar17->data != pVVar7) {
                          uVar12 = 1;
                          do {
                            uVar13 = uVar12;
                            if (newSize_00 == uVar13) break;
                            uVar12 = uVar13 + 1;
                          } while (pSVar17->data[uVar13] != pVVar7);
                          if (newSize_00 <= uVar13) goto LAB_00271022;
                        }
                      }
                    }
                    uVar11 = (uint)uVar14 + 2;
                    uVar14 = (ulong)uVar11;
                  } while (uVar11 < uVar10);
                  if (bVar3) goto LAB_00271113;
                }
                if (newSize_00 == 0) {
LAB_002710a4:
                  if (newSize_00 == (pVVar16->liveOut).max) {
                    SmallArray<VmInstruction_*,_4U>::grow(pSVar17,newSize_00);
                  }
                  goto LAB_002710f2;
                }
                if (*pSVar17->data != pVVar9) {
                  uVar14 = 1;
                  do {
                    uVar12 = uVar14;
                    if (newSize_00 == uVar12) break;
                    uVar14 = uVar12 + 1;
                  } while (pSVar17->data[uVar12] != pVVar9);
                  if (newSize_00 <= uVar12) goto LAB_002710a4;
                }
              }
              else {
                if (newSize_00 != 0) {
                  if (*pSVar17->data != pVVar9) {
                    uVar14 = 1;
                    do {
                      uVar12 = uVar14;
                      if (newSize_00 == uVar12) break;
                      uVar14 = uVar12 + 1;
                    } while (pSVar17->data[uVar12] != pVVar9);
                    if (newSize_00 <= uVar12) goto LAB_002710e1;
                  }
                  goto LAB_00271113;
                }
LAB_002710e1:
                if (newSize_00 == (pVVar16->liveOut).max) {
                  SmallArray<VmInstruction_*,_4U>::grow(pSVar17,newSize_00);
                }
LAB_002710f2:
                if (pSVar17->data == (VmInstruction **)0x0) goto LAB_00271414;
                uVar10 = (pVVar16->liveOut).count;
                newSize_00 = uVar10 + 1;
                (pVVar16->liveOut).count = newSize_00;
                pSVar17->data[uVar10] = pVVar9;
              }
LAB_00271113:
              uVar8 = uVar8 + 1;
            } while (uVar8 < (pVVar1->liveIn).count);
            uVar10 = (pVVar16->successors).count;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar10);
        pSVar17 = &pVVar16->liveIn;
        uVar11 = (pVVar16->liveIn).count;
        (pVVar16->liveIn).count = 0;
        if (newSize_00 == 0) goto LAB_0027122b;
        newSize = 0;
        uVar6 = 0;
        do {
          ppVVar4 = (pVVar16->liveOut).data;
          pVVar9 = ppVVar4[uVar6];
          if (pVVar9->parent != pVVar16) {
            if (newSize != 0) {
              if (*pSVar17->data == pVVar9) {
LAB_00271433:
                __assert_fail("!curr->liveIn.contains(curr->liveOut[i])",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x957,"void VmFunction::UpdateLiveSets(VmModule *)");
              }
              uVar8 = 1;
              do {
                uVar14 = uVar8;
                if (newSize == uVar14) break;
                uVar8 = uVar14 + 1;
              } while (pSVar17->data[uVar14] != pVVar9);
              if (uVar14 < newSize) goto LAB_00271433;
            }
            if (newSize == (pVVar16->liveIn).max) {
              SmallArray<VmInstruction_*,_4U>::grow(pSVar17,newSize);
            }
            if (pSVar17->data == (VmInstruction **)0x0) goto LAB_00271414;
            pVVar9 = ppVVar4[uVar6];
            uVar10 = (pVVar16->liveIn).count;
            newSize = uVar10 + 1;
            (pVVar16->liveIn).count = newSize;
            pSVar17->data[uVar10] = pVVar9;
            newSize_00 = (pVVar16->liveOut).count;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < newSize_00);
      }
      pSVar17 = &pVVar16->liveIn;
      puVar15 = &(pVVar16->liveIn).count;
      for (pVVar9 = pVVar16->firstInstruction; pVVar9 != (VmInstruction *)0x0;
          pVVar9 = pVVar9->nextSibling) {
        if ((pVVar9->arguments).count != 0) {
          uVar6 = 0;
          do {
            pVVar7 = (VmInstruction *)(pVVar9->arguments).data[uVar6];
            if ((pVVar7 != (VmInstruction *)0x0) && ((pVVar7->super_VmValue).typeID == 2)) {
              if (pVVar9->cmd == VM_INST_PHI) {
                if (newSize == 0) {
LAB_002712a2:
                  if (newSize == (pVVar16->liveIn).max) {
                    SmallArray<VmInstruction_*,_4U>::grow(pSVar17,newSize);
                  }
                  ppVVar4 = pSVar17->data;
                  pVVar7 = pVVar9;
LAB_00271306:
                  if (ppVVar4 == (VmInstruction **)0x0) goto LAB_00271414;
                  uVar10 = *puVar15;
                  newSize = uVar10 + 1;
                  *puVar15 = newSize;
                  ppVVar4[uVar10] = pVVar7;
                }
                else if (*pSVar17->data != pVVar9) {
                  uVar8 = 1;
                  do {
                    uVar14 = uVar8;
                    if (newSize == uVar14) break;
                    uVar8 = uVar14 + 1;
                  } while (pSVar17->data[uVar14] != pVVar9);
                  if (newSize <= uVar14) goto LAB_002712a2;
                }
              }
              else if (pVVar7->parent != pVVar16) {
                if (newSize == 0) {
LAB_002712f0:
                  if (newSize == (pVVar16->liveIn).max) {
                    SmallArray<VmInstruction_*,_4U>::grow(pSVar17,newSize);
                  }
                  ppVVar4 = pSVar17->data;
                  goto LAB_00271306;
                }
                if (*pSVar17->data != pVVar7) {
                  uVar8 = 1;
                  do {
                    uVar14 = uVar8;
                    if (newSize == uVar14) break;
                    uVar8 = uVar14 + 1;
                  } while (pSVar17->data[uVar14] != pVVar7);
                  if (newSize <= uVar14) goto LAB_002712f0;
                }
              }
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < (pVVar9->arguments).count);
        }
      }
      uVar10 = local_148.count;
      if ((uVar11 != newSize) && (uVar11 = (pVVar16->predecessors).count, uVar11 != 0)) {
        uVar6 = 0;
        do {
          pVVar1 = (pVVar16->predecessors).data[uVar6];
          if (uVar10 == 0) {
LAB_00271393:
            if (uVar10 == local_148.max) {
              SmallArray<VmBlock_*,_32U>::grow(&local_148,uVar10);
            }
            if (local_148.data == (VmBlock **)0x0) goto LAB_00271452;
            uVar10 = local_148.count + 1;
            local_148.data[local_148.count] = pVVar1;
            uVar11 = (pVVar16->predecessors).count;
            local_148.count = uVar10;
          }
          else if (*local_148.data != pVVar1) {
            uVar8 = 1;
            do {
              uVar14 = uVar8;
              if (uVar10 == uVar14) break;
              uVar8 = uVar14 + 1;
            } while (local_148.data[uVar14] != pVVar1);
            if (uVar10 <= uVar14) goto LAB_00271393;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar11);
      }
    }
  }
  SmallArray<VmBlock_*,_32U>::~SmallArray(&local_148);
  return;
LAB_00271414:
  __function = 
  "void SmallArray<VmInstruction *, 4>::push_back(const T &) [T = VmInstruction *, N = 4]";
  goto LAB_00271429;
LAB_00271452:
  __function = "void SmallArray<VmBlock *, 32>::push_back(const T &) [T = VmBlock *, N = 32]";
LAB_00271429:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

void VmFunction::UpdateLiveSets(VmModule *module)
{
	SmallArray<VmBlock*, 32> worklist(module->allocator);

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		curr->liveIn.clear();
		curr->liveOut.clear();

		worklist.push_back(curr);
	}

	while(!worklist.empty())
	{
		VmBlock *curr = worklist.back();
		worklist.pop_back();

		// Update block liveOut list
		curr->liveOut.clear();

		for(unsigned successorPos = 0; successorPos < curr->successors.size(); successorPos++)
		{
			VmBlock *successor = curr->successors[successorPos];

			for(unsigned k = 0; k < successor->liveIn.size(); k++)
			{
				VmInstruction *liveIn = successor->liveIn[k];

				bool found = false;

				if(liveIn->cmd == VM_INST_PHI)
				{
					for(unsigned argument = 0; argument < liveIn->arguments.size(); argument += 2)
					{
						VmInstruction *instruction = getType<VmInstruction>(liveIn->arguments[argument]);
						VmBlock *edge = getType<VmBlock>(liveIn->arguments[argument + 1]);

						if(edge == curr)
						{
							if(!curr->liveOut.contains(instruction))
								curr->liveOut.push_back(instruction);

							found = true;
						}
					}

					if(!found)
					{
						if(!curr->liveOut.contains(liveIn))
							curr->liveOut.push_back(liveIn);
					}
				}
				else
				{
					if(!curr->liveOut.contains(liveIn))
						curr->liveOut.push_back(liveIn);
				}
			}
		}

		unsigned liveInSize = curr->liveIn.size();

		// Update block liveIn list
		curr->liveIn.clear();

		// Add all liveOut variables that are not defined by current block
		for(unsigned i = 0; i < curr->liveOut.size(); i++)
		{
			if(curr->liveOut[i]->parent != curr)
			{
				assert(!curr->liveIn.contains(curr->liveOut[i]));
				curr->liveIn.push_back(curr->liveOut[i]);
			}
		}

		// Add all arguments from phi isntructions and all arguments that are not defined in current block
		for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
		{
			for(unsigned i = 0; i < inst->arguments.size(); i++)
			{
				if(VmInstruction *argument = getType<VmInstruction>(inst->arguments[i]))
				{
					if(inst->cmd == VM_INST_PHI)
					{
						if(!curr->liveIn.contains(inst))
							curr->liveIn.push_back(inst);
					}
					else
					{
						if(argument->parent != curr)
						{
							if(!curr->liveIn.contains(argument))
								curr->liveIn.push_back(argument);
						}
					}
				}
			}
		}

		if(liveInSize != curr->liveIn.size())
		{
			for(unsigned i = 0; i < curr->predecessors.size(); i++)
			{
				VmBlock *predecessor = curr->predecessors[i];

				if(!worklist.contains(predecessor))
					worklist.push_back(predecessor);
			}
		}
	}
}